

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::~BinaryRegistryWriter(BinaryRegistryWriter *this)

{
  ProgramBinary *pPVar1;
  pointer pBVar2;
  
  for (pBVar2 = (this->m_binaries).
                super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar2 != (this->m_binaries).
                super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                ._M_impl.super__Vector_impl_data._M_finish; pBVar2 = pBVar2 + 1) {
    pPVar1 = pBVar2->binary;
    if (pPVar1 != (ProgramBinary *)0x0) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&(pPVar1->m_binary).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    operator_delete(pPVar1,0x20);
  }
  std::
  _Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ::~_Vector_base(&(this->m_binaries).
                   super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                 );
  de::MemPool::~MemPool(&(this->m_binaryHash).m_memPool);
  std::
  vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ::~vector(&this->m_binaryIndices);
  return;
}

Assistant:

BinaryRegistryWriter::~BinaryRegistryWriter (void)
{
	for (BinaryVector::const_iterator binaryIter = m_binaries.begin();
		 binaryIter != m_binaries.end();
		 ++binaryIter)
		delete binaryIter->binary;
}